

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChPlasticityCosseratLumped::ChPlasticityCosseratLumped
          (ChPlasticityCosseratLumped *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChFunction *__tmp;
  
  (this->super_ChPlasticityCosserat).section = (ChBeamSectionCosserat *)0x0;
  (this->super_ChPlasticityCosserat).nr_yeld_tolerance = 1e-07;
  (this->super_ChPlasticityCosserat).nr_yeld_maxiters = 5;
  (this->super_ChPlasticityCosserat)._vptr_ChPlasticityCosserat =
       (_func_int **)&PTR__ChPlasticityCosseratLumped_00b4d810;
  (this->n_yeld_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_yeld_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_beta_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_beta_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_yeld_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_yeld_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_beta_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_beta_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_yeld_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_yeld_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_beta_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_beta_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_yeld_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_yeld_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_beta_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_beta_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_yeld_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_yeld_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_beta_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_beta_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_yeld_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_yeld_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->n_beta_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->n_beta_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0x408f4000;
  (this->n_yeld_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_yeld_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_yeld_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->n_beta_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_beta_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_beta_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0x408f4000;
  (this->n_yeld_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_yeld_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_yeld_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->n_beta_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_beta_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_beta_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0x408f4000;
  (this->n_yeld_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_yeld_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_yeld_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->n_beta_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_beta_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_beta_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0x408f4000;
  (this->n_yeld_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_yeld_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_yeld_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->n_beta_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_beta_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_beta_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0x408f4000;
  (this->n_yeld_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_yeld_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_yeld_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->n_beta_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_beta_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_beta_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0x408f4000;
  (this->n_yeld_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_yeld_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_yeld_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->n_beta_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->n_beta_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->n_beta_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

ChPlasticityCosseratLumped::ChPlasticityCosseratLumped() {
    // Default: linear isotropic constant hardening
    n_yeld_x = chrono_types::make_shared<ChFunction_Const>(1000);
    n_beta_x = chrono_types::make_shared<ChFunction_Const>(0);
    n_yeld_y = chrono_types::make_shared<ChFunction_Const>(1000);
    n_beta_y = chrono_types::make_shared<ChFunction_Const>(0);
    n_yeld_z = chrono_types::make_shared<ChFunction_Const>(1000);
    n_beta_z = chrono_types::make_shared<ChFunction_Const>(0);
    n_yeld_Mx = chrono_types::make_shared<ChFunction_Const>(1000);
    n_beta_Mx = chrono_types::make_shared<ChFunction_Const>(0);
    n_yeld_My = chrono_types::make_shared<ChFunction_Const>(1000);
    n_beta_My = chrono_types::make_shared<ChFunction_Const>(0);
    n_yeld_Mz = chrono_types::make_shared<ChFunction_Const>(1000);
    n_beta_Mz = chrono_types::make_shared<ChFunction_Const>(0);
}